

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::StartCall(SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
               bool tailcall)

{
  ulong uVar1;
  SQFunctionProto *pSVar2;
  ulong uVar3;
  long lVar4;
  SQObjectPtr *pSVar5;
  CallInfo *pCVar6;
  bool bVar7;
  SQArray *x;
  SQGenerator *this_00;
  char *s;
  SQFunctionProto *f;
  long lVar8;
  long lVar9;
  SQInteger n;
  long lVar10;
  long lVar11;
  SQObjectPtr temp;
  
  pSVar2 = closure->_function;
  uVar3 = pSVar2->_nparameters;
  lVar4 = pSVar2->_stacksize;
  if (pSVar2->_varparams == 0) {
    if (uVar3 != args) {
      lVar9 = pSVar2->_ndefaultparams;
      lVar11 = uVar3 - args;
      if (((lVar11 == 0 || (long)uVar3 < args) || lVar9 == 0) ||
         (lVar10 = lVar9 - lVar11, lVar9 < lVar11)) {
        s = "wrong number of parameters (%d passed, %d required)";
        goto LAB_00125803;
      }
      lVar11 = lVar10 * 0x10;
      lVar8 = args * 0x10 + stackbase * 0x10;
      for (; lVar10 < lVar9; lVar10 = lVar10 + 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar8),
                   (SQObjectPtr *)((long)&(closure->_defaultparams->super_SQObject)._type + lVar11))
        ;
        lVar11 = lVar11 + 0x10;
        lVar8 = lVar8 + 0x10;
      }
    }
  }
  else {
    uVar1 = uVar3 - 1;
    lVar9 = args - uVar1;
    if (args < (long)uVar1) {
      s = "wrong number of parameters (%d passed, at least %d required)";
      uVar3 = uVar1;
LAB_00125803:
      Raise_Error(this,s,args & 0xffffffff,uVar3 & 0xffffffff);
      return false;
    }
    x = SQArray::Create(this->_sharedstate,lVar9);
    lVar11 = 0;
    if (lVar9 < 1) {
      lVar9 = lVar11;
    }
    while( true ) {
      pSVar5 = (this->_stack)._vals;
      if (lVar9 == 0) break;
      SQObjectPtr::operator=
                ((SQObjectPtr *)((long)&(((x->_values)._vals)->super_SQObject)._type + lVar11),
                 (SQObjectPtr *)
                 ((long)&pSVar5[stackbase + (uVar3 - 1)].super_SQObject._type + lVar11));
      SQObjectPtr::Null((SQObjectPtr *)
                        ((long)&(this->_stack)._vals[stackbase + (uVar3 - 1)].super_SQObject._type +
                        lVar11));
      lVar11 = lVar11 + 0x10;
      lVar9 = lVar9 + -1;
    }
    SQObjectPtr::operator=(pSVar5 + uVar1 + stackbase,x);
  }
  if (closure->_env != (SQWeakRef *)0x0) {
    SQObjectPtr::operator=((this->_stack)._vals + stackbase,&closure->_env->_obj);
  }
  bVar7 = EnterFrame(this,stackbase,lVar4 + stackbase,tailcall);
  if (bVar7) {
    SQObjectPtr::operator=(&this->ci->_closure,closure);
    pCVar6 = this->ci;
    pCVar6->_literals = pSVar2->_literals;
    pCVar6->_ip = pSVar2->_instructions;
    pCVar6->_target = (SQInt32)target;
    if (this->_debughook == true) {
      CallDebugHook(this,99,0);
    }
    pSVar2 = closure->_function;
    if (pSVar2->_bgenerator != true) {
      return true;
    }
    this_00 = SQGenerator::Create(this->_sharedstate,closure);
    bVar7 = SQGenerator::Yield(this_00,this,pSVar2->_stacksize);
    if (bVar7) {
      temp.super_SQObject._type = OT_NULL;
      temp.super_SQObject._unVal.pTable = (SQTable *)0x0;
      Return(this,1,target,&temp);
      SQObjectPtr::operator=((this->_stack)._vals + this->_stackbase + target,this_00);
      SQObjectPtr::~SQObjectPtr(&temp);
      return true;
    }
  }
  return false;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters (%d passed, at least %d required)"),
              (int)nargs, (int)paramssize);
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters (%d passed, %d required)"),
              (int)nargs, (int)paramssize);
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;

    if (_debughook) {
        CallDebugHook(_SC('c'));
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return(1, target, temp);
        STK(target) = gen;
    }


    return true;
}